

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

void __thiscall tinygltf::Value::Value(Value *this,Value *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  double dVar4;
  undefined8 uVar5;
  pointer puVar6;
  pointer pVVar7;
  int iVar8;
  
  iVar8 = param_1->int_value_;
  dVar4 = param_1->real_value_;
  this->type_ = param_1->type_;
  this->int_value_ = iVar8;
  this->real_value_ = dVar4;
  paVar1 = &(this->string_value_).field_2;
  (this->string_value_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_1->string_value_)._M_dataplus._M_p;
  paVar2 = &(param_1->string_value_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(param_1->string_value_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->string_value_).field_2 + 8) = uVar5;
  }
  else {
    (this->string_value_)._M_dataplus._M_p = pcVar3;
    (this->string_value_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->string_value_)._M_string_length = (param_1->string_value_)._M_string_length;
  (param_1->string_value_)._M_dataplus._M_p = (pointer)paVar2;
  (param_1->string_value_)._M_string_length = 0;
  (param_1->string_value_).field_2._M_local_buf[0] = '\0';
  puVar6 = (param_1->binary_value_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar6;
  (this->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  pVVar7 = (param_1->array_value_).
           super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl
  .super__Vector_impl_data._M_start =
       (param_1->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl
  .super__Vector_impl_data._M_finish = pVVar7;
  (this->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (param_1->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->object_value_)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->object_value_)._M_t._M_impl.super__Rb_tree_header);
  this->boolean_value_ = param_1->boolean_value_;
  return;
}

Assistant:

char Type() const { return static_cast<char>(type_); }